

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void GEO::Process::initialize(int flags)

{
  index_t num_threads;
  Environment *pEVar1;
  Environment *this;
  char *pcVar2;
  
  pEVar1 = Environment::instance();
  this = (Environment *)operator_new(0x58);
  Environment::Environment(this);
  (this->super_Counted)._vptr_Counted = (_func_int **)&PTR__SystemEnvironment_001ae5d0;
  (*(pEVar1->super_Counted)._vptr_Counted[2])(pEVar1,this);
  os_init_threads();
  pcVar2 = getenv("GEO_NO_SIGNAL_HANDLER");
  if (((flags & 1U) != 0) && (pcVar2 == (char *)0x0)) {
    os_install_signal_handlers();
  }
  enable_multithreading((bool)::(anonymous_namespace)::multithreading_enabled_);
  num_threads = number_of_cores();
  set_max_threads(num_threads);
  enable_FPE((bool)::(anonymous_namespace)::fpe_enabled_);
  enable_cancel((bool)::(anonymous_namespace)::cancel_enabled_);
  ::(anonymous_namespace)::start_time_ = SystemStopwatch::now();
  return;
}

Assistant:

void initialize(int flags) {

            Environment* env = Environment::instance();
            env->add_environment(new ProcessEnvironment);

            if(!os_init_threads()) {
#ifdef GEO_OPENMP
                Logger::out("Process")
                    << "Using OpenMP threads"
                    << std::endl;
                set_thread_manager(new OMPThreadManager);
#else
                Logger::out("Process")
                    << "Multithreading not supported, going monothread"
                    << std::endl;
                set_thread_manager(new MonoThreadingThreadManager);
#endif
            }

	    if(
		(::getenv("GEO_NO_SIGNAL_HANDLER") == nullptr) &&
		(flags & GEOGRAM_INSTALL_HANDLERS) != 0
	    ) {
		os_install_signal_handlers();
	    }
	    
            // Initialize Process default values
            enable_multithreading(multithreading_enabled_);
            set_max_threads(number_of_cores());
            enable_FPE(fpe_enabled_);
            enable_cancel(cancel_enabled_);

            start_time_ = SystemStopwatch::now();
        }